

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmClientContext.cpp
# Opt level: O3

GMM_CLIENT_CONTEXT * GmmCreateClientContextForAdapter(GMM_CLIENT ClientType,ADAPTER_BDF sBdf)

{
  Context *pLibContext;
  GmmClientContext *this;
  
  pLibContext = GmmLib::GmmMultiAdapterContext::GetAdapterLibContext(pGmmMALibContext,sBdf);
  if ((pLibContext != (Context *)0x0) &&
     (this = (GmmClientContext *)malloc(0x50), this != (GmmClientContext *)0x0)) {
    GmmLib::GmmClientContext::GmmClientContext(this,ClientType,pLibContext);
    return this;
  }
  return (GMM_CLIENT_CONTEXT *)0x0;
}

Assistant:

GMM_CLIENT_CONTEXT *GMM_STDCALL GmmCreateClientContextForAdapter(GMM_CLIENT  ClientType,
                                                                            ADAPTER_BDF sBdf)
{
    GMM_CLIENT_CONTEXT *pGmmClientContext = nullptr;
    GMM_LIB_CONTEXT *   pLibContext       = pGmmMALibContext->GetAdapterLibContext(sBdf);

    if (pLibContext)
    {
        pGmmClientContext = new GMM_CLIENT_CONTEXT(ClientType, pLibContext);

    }
    return pGmmClientContext;
}